

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O3

void __thiscall
QPDFTokenizer::Token::Token
          (Token *this,token_type_e type,string *value,string *raw_value,string *error_message)

{
  pointer pcVar1;
  
  this->type = type;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + value->_M_string_length);
  (this->raw_value)._M_dataplus._M_p = (pointer)&(this->raw_value).field_2;
  pcVar1 = (raw_value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->raw_value,pcVar1,pcVar1 + raw_value->_M_string_length);
  (this->error_message)._M_dataplus._M_p = (pointer)&(this->error_message).field_2;
  pcVar1 = (error_message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->error_message,pcVar1,pcVar1 + error_message->_M_string_length);
  return;
}

Assistant:

Token(
            token_type_e type,
            std::string const& value,
            std::string raw_value,
            std::string error_message) :
            type(type),
            value(value),
            raw_value(raw_value),
            error_message(error_message)
        {
        }